

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_size_resp(connectdata *conn,int ftpcode,ftpstate instate)

{
  SessionHandle *data_00;
  CURLcode CVar1;
  char *buffer;
  long local_48;
  char *buf;
  curl_off_t filesize;
  SessionHandle *data;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  buffer = (data_00->state).buffer;
  if (ftpcode == 0xd5) {
    local_48 = strtol((data_00->state).buffer + 4,(char **)0x0,0);
  }
  else {
    local_48 = -1;
  }
  if (instate == FTP_SIZE) {
    if (local_48 != -1) {
      curl_msnprintf(buffer,0x4001,"Content-Length: %ld\r\n",local_48);
      CVar1 = Curl_client_write(conn,3,buffer,0);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    Curl_pgrsSetDownloadSize(data_00,local_48);
    data._4_4_ = ftp_state_rest(conn);
  }
  else if (instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data_00,local_48);
    data._4_4_ = ftp_state_retr(conn,local_48);
  }
  else if (instate == FTP_STOR_SIZE) {
    (data_00->state).resume_from = local_48;
    data._4_4_ = ftp_state_ul_setup(conn,true);
  }
  return data._4_4_;
}

Assistant:

static CURLcode ftp_state_size_resp(struct connectdata *conn,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data=conn->data;
  curl_off_t filesize;
  char *buf = data->state.buffer;

  /* get the size from the ascii string: */
  filesize = (ftpcode == 213)?curlx_strtoofft(buf+4, NULL, 0):-1;

  if(instate == FTP_SIZE) {
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(-1 != filesize) {
      snprintf(buf, sizeof(data->state.buffer),
               "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", filesize);
      result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
      if(result)
        return result;
    }
#endif
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_rest(conn);
  }
  else if(instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_retr(conn, filesize);
  }
  else if(instate == FTP_STOR_SIZE) {
    data->state.resume_from = filesize;
    result = ftp_state_ul_setup(conn, TRUE);
  }

  return result;
}